

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

int nullcInitTypeinfoModule(void)

{
  bool bVar1;
  int iVar2;
  undefined1 local_28 [8];
  TraceScope traceScope;
  
  if (nullcInitTypeinfoModule::token == '\0') {
    iVar2 = __cxa_guard_acquire(&nullcInitTypeinfoModule::token);
    if (iVar2 != 0) {
      nullcInitTypeinfoModule::token = NULLC::TraceGetToken("nullc","nullcInitTypeinfoModule");
      __cxa_guard_release(&nullcInitTypeinfoModule::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_28,nullcInitTypeinfoModule::token);
  bVar1 = nullcInitTypeinfoModule(NULLC::linker);
  NULLC::TraceScope::~TraceScope((TraceScope *)local_28);
  return (uint)bVar1;
}

Assistant:

int nullcInitTypeinfoModule()
{
	TRACE_SCOPE("nullc", "nullcInitTypeinfoModule");

	return nullcInitTypeinfoModule(NULLC::linker);
}